

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_fmtimer.cpp
# Opt level: O3

bool __thiscall FM::Timer::Count(Timer *this,int32 us)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = this->timera_count;
  if (iVar2 != 0) {
    iVar1 = iVar2 + us * -0x10000;
    this->timera_count = iVar1;
    if (iVar1 == 0 || SBORROW4(iVar2,us * 0x10000) != iVar1 < 0) {
      (*this->_vptr_Timer[2])(this);
      iVar2 = this->timera_count;
      if (iVar2 < 1) {
        do {
          bVar3 = SCARRY4(iVar2,this->timera);
          iVar2 = iVar2 + this->timera;
        } while (iVar2 == 0 || bVar3 != iVar2 < 0);
        this->timera_count = iVar2;
      }
      bVar3 = true;
      if ((this->regtc & 4) != 0) {
        (**this->_vptr_Timer)(this,1);
      }
      goto LAB_00179b15;
    }
  }
  bVar3 = false;
LAB_00179b15:
  iVar2 = this->timerb_count;
  if (iVar2 != 0) {
    iVar1 = iVar2 + us * -0x1000;
    this->timerb_count = iVar1;
    if (iVar1 == 0 || SBORROW4(iVar2,us * 0x1000) != iVar1 < 0) {
      do {
        iVar1 = iVar1 + this->timerb;
      } while (iVar1 < 1);
      this->timerb_count = iVar1;
      bVar3 = true;
      if ((this->regtc & 8) != 0) {
        (**this->_vptr_Timer)(this,2);
      }
    }
  }
  return bVar3;
}

Assistant:

bool Timer::Count(int32 us)
{
	bool event = false;

	if (timera_count)
	{
		timera_count -= us << 16;
		if (timera_count <= 0)
		{
			event = true;
			TimerA();

			while (timera_count <= 0)
				timera_count += timera;
			
			if (regtc & 4)
				SetStatus(1);
		}
	}
	if (timerb_count)
	{
		timerb_count -= us << 12;
		if (timerb_count <= 0)
		{
			event = true;
			while (timerb_count <= 0)
				timerb_count += timerb;
			
			if (regtc & 8)
				SetStatus(2);
		}
	}
	return event;
}